

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprCodeAtInit(Parse *pParse,Expr *pExpr,int regDest)

{
  int iVar1;
  Expr *pExpr_00;
  ExprList *pEVar2;
  long lVar3;
  int iVar4;
  anon_union_4_2_6146edf4_for_u *paVar5;
  
  pEVar2 = pParse->pConstExpr;
  if ((pEVar2 != (ExprList *)0x0 && regDest < 0) && (0 < pEVar2->nExpr)) {
    iVar4 = pEVar2->nExpr + 1;
    paVar5 = &pEVar2->a[0].u;
    do {
      if (((paVar5->iConstExprReg & 0x40000000000U) != 0) &&
         (iVar1 = sqlite3ExprCompare((Parse *)0x0,((ExprList_item *)(paVar5 + -7))->pExpr,pExpr,-1),
         iVar1 == 0)) {
        return paVar5->iConstExprReg;
      }
      iVar4 = iVar4 + -1;
      paVar5 = paVar5 + 8;
    } while (1 < iVar4);
  }
  if (pExpr == (Expr *)0x0) {
    pExpr_00 = (Expr *)0x0;
  }
  else {
    pExpr_00 = exprDup(pParse->db,pExpr,0,(u8 **)0x0);
  }
  pEVar2 = sqlite3ExprListAppend((Parse *)pParse->db,pEVar2,pExpr_00);
  if (pEVar2 != (ExprList *)0x0) {
    lVar3 = (long)pEVar2->nExpr;
    pEVar2->a[lVar3 + -1].field_0x19 =
         pEVar2->a[lVar3 + -1].field_0x19 & 0xfb | (byte)((uint)regDest >> 0x1d) & 4;
    if (regDest < 0) {
      regDest = pParse->nMem + 1;
      pParse->nMem = regDest;
    }
    pEVar2->a[lVar3 + -1].u.iConstExprReg = regDest;
  }
  pParse->pConstExpr = pEVar2;
  return regDest;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeAtInit(
  Parse *pParse,    /* Parsing context */
  Expr *pExpr,      /* The expression to code when the VDBE initializes */
  int regDest       /* Store the value in this register */
){
  ExprList *p;
  assert( ConstFactorOk(pParse) );
  p = pParse->pConstExpr;
  if( regDest<0 && p ){
    struct ExprList_item *pItem;
    int i;
    for(pItem=p->a, i=p->nExpr; i>0; pItem++, i--){
      if( pItem->reusable && sqlite3ExprCompare(0,pItem->pExpr,pExpr,-1)==0 ){
        return pItem->u.iConstExprReg;
      }
    }
  }
  pExpr = sqlite3ExprDup(pParse->db, pExpr, 0);
  p = sqlite3ExprListAppend(pParse, p, pExpr);
  if( p ){
     struct ExprList_item *pItem = &p->a[p->nExpr-1];
     pItem->reusable = regDest<0;
     if( regDest<0 ) regDest = ++pParse->nMem;
     pItem->u.iConstExprReg = regDest;
  }
  pParse->pConstExpr = p;
  return regDest;
}